

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test::TestBody
          (MessageDifferencerTest_TreatRepeatedFieldAsMapWithIgnoredKeyFields_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  FieldDescriptor *field;
  FieldDescriptor *key;
  tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  this_00;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string_view input_00;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differ;
  __uniq_ptr_impl<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  local_390;
  AssertHelper local_388;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_380;
  Message *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  Message local_368;
  string local_358;
  TestDiffMessage local_338;
  TestDiffMessage local_280;
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&local_338,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&local_280,(Arena *)0x0);
  input._M_str = (char *)&local_338;
  input._M_len = (size_t)"rm { a: 11\n m { a: 12\n b: 13\n } }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000021,input,in_RCX);
  input_00._M_str = (char *)&local_280;
  input_00._M_len = (size_t)"rm { a: 11\n m { a: 12\n b: 14\n } }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000021,input_00,in_RCX);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  paVar1 = &local_358.field_2;
  local_358._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"rm","");
  field = GetFieldDescriptor((anon_unknown_0 *)&local_338,(Message *)local_358._M_dataplus._M_p,
                             (string *)local_358._M_string_length);
  local_378 = &local_368;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"rm.m","");
  key = GetFieldDescriptor((anon_unknown_0 *)&local_338,local_378,local_370);
  util::MessageDifferencer::TreatAsMap(&local_1c8,field,key);
  if (local_378 != &local_368) {
    operator_delete(local_378,(long)local_368.super_MessageLite._vptr_MessageLite + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != paVar1) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  this_00.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )operator_new(8);
  *(_func_int ***)
   this_00.
   super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
   .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
   _M_head_impl = (_func_int **)0x0;
  util::MessageDifferencer::IgnoreCriteria::IgnoreCriteria
            ((IgnoreCriteria *)
             this_00.
             super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
             .
             super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
             ._M_head_impl);
  *(undefined ***)
   this_00.
   super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
   .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
   _M_head_impl = &PTR__IgnoreCriteria_018f2160;
  local_390._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )(tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                    )this_00.
                     super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                     .
                     super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
                     ._M_head_impl;
  util::MessageDifferencer::AddIgnoreCriteria
            (&local_1c8,
             (unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
              *)&local_390);
  if ((_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
       )local_390._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
        .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
        _M_head_impl != (IgnoreCriteria *)0x0) {
    (*(*(_func_int ***)
        local_390._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
        .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
        _M_head_impl)[1])();
  }
  local_390._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )(_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                    )0x0;
  bVar2 = util::MessageDifferencer::Compare
                    (&local_1c8,&local_338.super_Message,&local_280.super_Message);
  local_378 = (Message *)CONCAT71(local_378._1_7_,bVar2);
  local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_358,(internal *)&local_378,(AssertionResult *)"differ.Compare(msg1, msg2)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x96c,local_358._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_388,(Message *)&local_380);
    testing::internal::AssertHelper::~AssertHelper(&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != paVar1) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if (local_380._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_380._M_head_impl + 8))();
    }
    if (local_370 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_370,local_370);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&local_280);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&local_338);
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsMapWithIgnoredKeyFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n m { a: 12\n b: 13\n } }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n m { a: 12\n b: 14\n } }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsMap(GetFieldDescriptor(msg1, "rm"),
                    GetFieldDescriptor(msg1, "rm.m"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}